

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicMax::CheckIndexed(BasicMax *this,GLenum target,GLint *min_values)

{
  ulong uVar1;
  long lVar2;
  CallLogWrapper *this_00;
  GLuint index;
  GLboolean b;
  GLfloat f;
  GLint i;
  GLdouble d;
  GLint64 i64;
  GLboolean local_49;
  float local_48;
  uint local_44;
  double local_40;
  ulong local_38;
  
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  lVar2 = 0;
  do {
    glu::CallLogWrapper::glGetIntegeri_v(this_00,target,(GLuint)lVar2,(GLint *)&local_44);
    uVar1 = (ulong)local_44;
    if ((int)local_44 < min_values[lVar2]) goto LAB_00918a88;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    glu::CallLogWrapper::glGetInteger64i_v(this_00,target,(GLuint)lVar2,(GLint64 *)&local_38);
    uVar1 = local_38;
    if ((long)local_38 < (long)min_values[lVar2]) goto LAB_00918a88;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  do {
    glu::CallLogWrapper::glGetFloati_v(this_00,target,(GLuint)lVar2,&local_48);
    if (local_48 < (float)min_values[lVar2]) {
      uVar1 = (ulong)(uint)(int)local_48;
      goto LAB_00918a88;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  lVar2 = 0;
  while (glu::CallLogWrapper::glGetDoublei_v(this_00,target,(GLuint)lVar2,&local_40),
        (double)min_values[lVar2] <= local_40) {
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      index = 0;
      do {
        glu::CallLogWrapper::glGetBooleani_v(this_00,target,index,&local_49);
        if (local_49 == '\0') {
          anon_unknown_0::Output("Is GL_FALSE should be at least GL_TRUE.\n");
          return false;
        }
        index = index + 1;
      } while (index != 3);
      return true;
    }
  }
  uVar1 = (ulong)(uint)(int)local_40;
LAB_00918a88:
  anon_unknown_0::Output("Is %d should be at least %d.\n",uVar1);
  return false;
}

Assistant:

bool CheckIndexed(GLenum target, const GLint* min_values)
	{
		GLint	 i;
		GLint64   i64;
		GLfloat   f;
		GLdouble  d;
		GLboolean b;

		for (GLuint c = 0; c < 3; c++)
		{
			glGetIntegeri_v(target, c, &i);
			if (i < min_values[c])
			{
				Output("Is %d should be at least %d.\n", i, min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetInteger64i_v(target, c, &i64);
			if (i64 < static_cast<GLint64>(min_values[c]))
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(i64), min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetFloati_v(target, c, &f);
			if (f < static_cast<GLfloat>(min_values[c]))
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(f), min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetDoublei_v(target, c, &d);
			if (d < static_cast<GLdouble>(min_values[c]))
			{
				Output("Is %d should be at least %d.\n", static_cast<GLint>(d), min_values[c]);
				return false;
			}
		}
		for (GLuint c = 0; c < 3; c++)
		{
			glGetBooleani_v(target, c, &b);
			if (b == GL_FALSE)
			{
				Output("Is GL_FALSE should be at least GL_TRUE.\n");
				return false;
			}
		}

		return true;
	}